

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O2

void glfwMakeContextCurrent(GLFWwindow *handle)

{
  void *pvVar1;
  char *format;
  int code;
  
  if (_glfw.initialized == 0) {
    code = 0x10001;
    format = (char *)0x0;
LAB_0011989d:
    _glfwInputError(code,format);
    return;
  }
  pvVar1 = _glfwPlatformGetTls(&_glfw.contextSlot);
  if (handle == (GLFWwindow *)0x0) {
    if (pvVar1 == (void *)0x0) {
      return;
    }
  }
  else {
    if (*(int *)(handle + 0x200) == 0) {
      format = "Cannot make current with a window that has no OpenGL or OpenGL ES context";
      code = 0x1000a;
      goto LAB_0011989d;
    }
    if ((pvVar1 == (void *)0x0) || (*(int *)(handle + 0x204) == *(int *)((long)pvVar1 + 0x204)))
    goto LAB_00119888;
  }
  (**(code **)((long)pvVar1 + 0x248))(0);
  if (handle == (GLFWwindow *)0x0) {
    return;
  }
LAB_00119888:
  (**(code **)(handle + 0x248))();
  return;
}

Assistant:

GLFWAPI void glfwMakeContextCurrent(GLFWwindow* handle)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;
    _GLFWwindow* previous;

    _GLFW_REQUIRE_INIT();

    previous = _glfwPlatformGetTls(&_glfw.contextSlot);

    if (window && window->context.client == GLFW_NO_API)
    {
        _glfwInputError(GLFW_NO_WINDOW_CONTEXT,
                        "Cannot make current with a window that has no OpenGL or OpenGL ES context");
        return;
    }

    if (previous)
    {
        if (!window || window->context.source != previous->context.source)
            previous->context.makeCurrent(NULL);
    }

    if (window)
        window->context.makeCurrent(window);
}